

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<long_long,QSocks5BindData*>::emplace_helper<QSocks5BindData*const&>
          (QHash<long_long,_QSocks5BindData_*> *this,longlong *key,QSocks5BindData **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<long_long,_QSocks5BindData_*> *n;
  iterator<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *in_RDX;
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::findOrInsert<long_long>
            (in_RSI,(longlong *)in_RDX);
  n = QHashPrivate::iterator<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::node(in_RDX);
  QHashPrivate::Node<long_long,QSocks5BindData*>::createInPlace<QSocks5BindData*const&>
            (n,(longlong *)in_RSI,(QSocks5BindData **)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<long_long,_QSocks5BindData_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }